

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server_test.c
# Opt level: O1

void test_server_post_handler(void)

{
  nng_http_client *pnVar1;
  nng_http_handler *__n;
  nng_err nVar2;
  int iVar3;
  nng_http_status nVar4;
  char *pcVar5;
  size_t sVar6;
  nng_http_handler *pnVar7;
  undefined1 local_888 [8];
  server_test st;
  char *rxdata;
  void *data;
  nng_http_handler *h;
  size_t size;
  char txdata [5];
  
  nVar2 = nng_http_handler_alloc((nng_http_handler **)&data,"/post",httpecho);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,0x24d,"%s: expected success, got %s (%d)",
                         "nng_http_handler_alloc(&h, \"/post\", httpecho)",pcVar5,nVar2);
  if (iVar3 != 0) {
    nng_http_handler_set_method((nng_http_handler *)data,"POST");
    server_setup((server_test *)local_888,(nng_http_handler *)data);
    size._4_1_ = 0;
    size._0_4_ = 0x34333231;
    nVar2 = nng_http_set_uri((nng_http *)st.cli,"/post",(char *)0x0);
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                           ,0x254,"%s: expected success, got %s (%d)",
                           "nng_http_set_uri(st.conn, \"/post\", NULL)",pcVar5,nVar2);
    pnVar1 = st.cli;
    if (iVar3 != 0) {
      sVar6 = strlen((char *)&size);
      nng_http_set_body((nng_http *)pnVar1,&size,sVar6);
      nng_http_set_method((nng_http *)st.cli,"POST");
      nVar2 = httpdo((server_test *)local_888,(void **)(st.urlstr + 0x7f8),(size_t *)&h);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                             ,599,"%s: expected success, got %s (%d)",
                             "httpdo(&st, (void **) &rxdata, &size)",pcVar5,nVar2);
      if (iVar3 != 0) {
        nVar4 = nng_http_get_status((nng_http *)st.cli);
        acutest_check_((uint)(nVar4 == NNG_HTTP_STATUS_OK),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,600,"%s","nng_http_get_status(st.conn) == (NNG_HTTP_STATUS_OK)");
        nVar4 = nng_http_get_status((nng_http *)st.cli);
        pcVar5 = nng_http_get_reason((nng_http *)st.cli);
        acutest_message_("HTTP status: expected %d (%s) got %d (%s)",200,"NNG_HTTP_STATUS_OK",
                         (ulong)nVar4,pcVar5);
        __n = h;
        pnVar7 = (nng_http_handler *)strlen((char *)&size);
        acutest_check_((uint)(__n == pnVar7),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,0x259,"%s","size == strlen(txdata)");
        iVar3 = strncmp((char *)&size,(char *)st.urlstr._2040_8_,(size_t)__n);
        acutest_check_((uint)(iVar3 == 0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,0x25a,"%s","strncmp(txdata, rxdata, size) == 0");
        nng_free((void *)st.urlstr._2040_8_,(size_t)__n);
        server_reset((server_test *)local_888);
        nVar2 = nng_http_set_uri((nng_http *)st.cli,"/post",(char *)0x0);
        pcVar5 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                               ,0x25f,"%s: expected success, got %s (%d)",
                               "nng_http_set_uri(st.conn, \"/post\", NULL)",pcVar5,nVar2);
        if (iVar3 != 0) {
          nng_http_set_method((nng_http *)st.cli,"GET");
          pnVar1 = st.cli;
          sVar6 = strlen((char *)&size);
          nng_http_set_body((nng_http *)pnVar1,&size,sVar6);
          nVar2 = httpdo((server_test *)local_888,&rxdata,(size_t *)&h);
          pcVar5 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                                 ,0x263,"%s: expected success, got %s (%d)",
                                 "httpdo(&st, &data, &size)",pcVar5,nVar2);
          if (iVar3 != 0) {
            nVar4 = nng_http_get_status((nng_http *)st.cli);
            acutest_check_((uint)(nVar4 == NNG_HTTP_STATUS_METHOD_NOT_ALLOWED),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                           ,0x264,"%s",
                           "nng_http_get_status(st.conn) == (NNG_HTTP_STATUS_METHOD_NOT_ALLOWED)");
            nVar4 = nng_http_get_status((nng_http *)st.cli);
            pcVar5 = nng_http_get_reason((nng_http *)st.cli);
            acutest_message_("HTTP status: expected %d (%s) got %d (%s)",0x195,
                             "NNG_HTTP_STATUS_METHOD_NOT_ALLOWED",(ulong)nVar4,pcVar5);
            nng_free(rxdata,(size_t)h);
            server_free((server_test *)local_888);
            return;
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_server_post_handler(void)
{
	struct server_test st;
	nng_http_handler  *h;
	char               txdata[5];
	char              *rxdata;
	size_t             size;
	void              *data;

	NUTS_PASS(nng_http_handler_alloc(&h, "/post", httpecho));
	nng_http_handler_set_method(h, "POST");

	server_setup(&st, h);

	snprintf(txdata, sizeof(txdata), "1234");

	NUTS_PASS(nng_http_set_uri(st.conn, "/post", NULL));
	nng_http_set_body(st.conn, txdata, strlen(txdata));
	nng_http_set_method(st.conn, "POST");
	NUTS_PASS(httpdo(&st, (void **) &rxdata, &size));
	NUTS_HTTP_STATUS(st.conn, NNG_HTTP_STATUS_OK);
	NUTS_TRUE(size == strlen(txdata));
	NUTS_TRUE(strncmp(txdata, rxdata, size) == 0);
	nng_free(rxdata, size);

	server_reset(&st);

	NUTS_PASS(nng_http_set_uri(st.conn, "/post", NULL));
	nng_http_set_method(st.conn, "GET");
	nng_http_set_body(st.conn, txdata, strlen(txdata));

	NUTS_PASS(httpdo(&st, &data, &size));
	NUTS_HTTP_STATUS(st.conn, NNG_HTTP_STATUS_METHOD_NOT_ALLOWED);
	nng_free(data, size);

	server_free(&st);
}